

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TonkCppSDK.cpp
# Opt level: O2

SDKJsonResult * __thiscall
tonk::SDKSocket::Create(SDKJsonResult *__return_storage_ptr__,SDKSocket *this)

{
  TonkResult TVar1;
  TonkSocketConfig config;
  TonkJson json;
  TonkSocketConfig local_488;
  TonkJson local_410;
  
  BlockingDestroy(this);
  local_488.WorkerCount = (this->Config).WorkerCount;
  local_488.UDPSendBufferSizeBytes = (this->Config).UDPSendBufferSizeBytes;
  local_488.UDPRecvBufferSizeBytes = (this->Config).UDPRecvBufferSizeBytes;
  local_488.UDPListenPort = (this->Config).UDPListenPort;
  local_488.MaximumClients = (this->Config).MaximumClients;
  local_488.MaximumClientsPerIP = (this->Config).MaximumClientsPerIP;
  local_488.MinuteFloodThresh = (this->Config).MinuteFloodThresh;
  local_488.TimerIntervalUsec = (this->Config).TimerIntervalUsec;
  local_488.NoDataTimeoutUsec = (this->Config).NoDataTimeoutUsec;
  local_488.UDPConnectIntervalUsec = (this->Config).UDPConnectIntervalUsec;
  local_488.ConnectionTimeoutUsec = (this->Config).ConnectionTimeoutUsec;
  local_488._60_4_ = *(undefined4 *)&(this->Config).field_0x3c;
  local_488.InterfaceAddress = (this->Config).InterfaceAddress;
  local_488.BandwidthLimitBPS = (this->Config).BandwidthLimitBPS;
  local_488.Flags = (this->Config).Flags;
  local_488.SendToAppContextPtr = (this->Config).SendToAppContextPtr;
  local_488.SendToHook = (this->Config).SendToHook;
  local_488._4_4_ = SUB84((ulong)*(undefined8 *)&this->Config >> 0x20,0);
  local_488.Version = 9;
  local_488.OnP2PConnectionStart = Create::anon_class_1_0_00000001::__invoke;
  local_488.OnIncomingConnection = Create::anon_class_1_0_00000001::__invoke;
  local_488.OnAdvertisement = Create::anon_class_1_0_00000001::__invoke;
  local_488.AppContextPtr = this;
  TVar1 = tonk_socket_create(&local_488,&this->MySocket,&local_410);
  (__return_storage_ptr__->super_SDKResult).Result = Tonk_Success;
  (__return_storage_ptr__->ErrorJson)._M_dataplus._M_p =
       (pointer)&(__return_storage_ptr__->ErrorJson).field_2;
  (__return_storage_ptr__->ErrorJson)._M_string_length = 0;
  (__return_storage_ptr__->ErrorJson).field_2._M_local_buf[0] = '\0';
  if (TVar1 != Tonk_Success) {
    (__return_storage_ptr__->super_SDKResult).Result = TVar1;
    std::__cxx11::string::assign((char *)&__return_storage_ptr__->ErrorJson);
  }
  return __return_storage_ptr__;
}

Assistant:

SDKJsonResult SDKSocket::Create()
{
    BlockingDestroy();

    TonkSocketConfig config = Config;

    // Override the following members:
    config.AppContextPtr = reinterpret_cast<TonkAppContextPtr>(this);
    config.Version = TONK_VERSION;
    config.OnP2PConnectionStart = [](
        TonkAppContextPtr context,
        TonkConnection connection,
        const TonkAddress* address,
        TonkConnectionConfig* configOut) -> uint32_t
    {
        SDKSocket* thiz = (SDKSocket*)context;
        SDKConnection* sdkConnection = thiz->OnP2PConnectionStart(*address);
        if (!sdkConnection) {
            return TONK_DENY_CONNECTION;
        }

        sdkConnection->MyConnection = connection;
        // Hold a self-reference if connection is started
        sdkConnection->SetSelfReference();

        *configOut = MakeConnectionConfig(sdkConnection);
        return TONK_ACCEPT_CONNECTION;
    };
    config.OnIncomingConnection = [](
        TonkAppContextPtr context,
        TonkConnection connection,
        const TonkAddress* address,
        TonkConnectionConfig* configOut) -> uint32_t
    {
        SDKSocket* thiz = (SDKSocket*)context;
        SDKConnection* sdkConnection = thiz->OnIncomingConnection(*address);
        if (!sdkConnection) {
            return TONK_DENY_CONNECTION;
        }

        sdkConnection->MyConnection = connection;
        // Hold a self-reference if connection is started
        sdkConnection->SelfReference = sdkConnection->shared_from_this();

        *configOut = MakeConnectionConfig(sdkConnection);
        return TONK_ACCEPT_CONNECTION;
    };
    config.OnAdvertisement = [](
        TonkAppContextPtr context,
        TonkSocket /*tonkSocket*/,
        const char* ipString,
        uint16_t port,
        uint8_t* data,
        uint32_t bytes)
    {
        SDKSocket* thiz = (SDKSocket*)context;
        thiz->OnAdvertisement(ipString, port, data, bytes);
    };

    TonkJson json;
    TonkResult result = tonk_socket_create(&config, &MySocket, &json);

    SDKJsonResult error;
    if (TONK_FAILED(result))
    {
        error.Result = result;
        error.ErrorJson = json.JsonString;
    }
    return error;
}